

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O2

DecodeStatus DecodeVectorRegisterClass(MCInst *Inst,uint RegNo,uint64_t Addr,void *Decoder)

{
  DecodeStatus in_EAX;
  DecodeStatus extraout_EAX;
  
  if (0x1f < RegNo) {
    return in_EAX;
  }
  MCOperand_CreateReg0(Inst,FPR128DecoderTable[RegNo]);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeVectorRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Addr,
		const void *Decoder)
{
	unsigned Register;

	if (RegNo > 31)
		return Fail;

	Register = VectorDecoderTable[RegNo];
	MCOperand_CreateReg0(Inst, Register);
	return Success;
}